

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format.cpp
# Opt level: O2

void __thiscall format_binary_Test::~format_binary_Test(format_binary_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(format, binary)
{
    EXPECT_EQ(ST_LITERAL("xx10011010010xx"), ST::format("xx{b}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx10011010010xx"), ST::format("xx{b}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx10011010010xx"), ST::format("xx{2b}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx10011010010xx"), ST::format("xx{>2b}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx10011010010xx"), ST::format("xx{<2b}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx     10011010010xx"), ST::format("xx{16b}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx     10011010010xx"), ST::format("xx{>16b}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx10011010010     xx"), ST::format("xx{<16b}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx    +10011010010xx"), ST::format("xx{+16b}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx    -10011010010xx"), ST::format("xx{16b}xx", -1234));
    EXPECT_EQ(ST_LITERAL("xx+10011010010    xx"), ST::format("xx{<+16b}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx-10011010010    xx"), ST::format("xx{<16b}xx", -1234));

    // Numeric padding
    EXPECT_EQ(ST_LITERAL("xx0000010011010010xx"), ST::format("xx{016b}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx0000010011010010xx"), ST::format("xx{<016b}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx-000010011010010xx"), ST::format("xx{016b}xx", -1234));
    EXPECT_EQ(ST_LITERAL("xx+000010011010010xx"), ST::format("xx{+016b}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx-000010011010010xx"), ST::format("xx{<016b}xx", -1234));
    EXPECT_EQ(ST_LITERAL("xx+000010011010010xx"), ST::format("xx{<+016b}xx", 1234));

    // Character types
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{b}xx", '\0'));
    EXPECT_EQ(ST_LITERAL("xx1000001xx"), ST::format("xx{b}xx", 'A'));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{b}xx", L'\0'));
    EXPECT_EQ(ST_LITERAL("xx1000001xx"), ST::format("xx{b}xx", L'A'));
    EXPECT_EQ(ST_LITERAL("xx111111111111111xx"), ST::format("xx{b}xx", L'\u7fff'));

    // Numeric char types
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{b}xx", (signed char)0));
    EXPECT_EQ(ST_LITERAL("xx1111011xx"), ST::format("xx{b}xx", (signed char)123));
    EXPECT_EQ(ST_LITERAL("xx-1111011xx"), ST::format("xx{b}xx", (signed char)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{b}xx", (unsigned char)0));
    EXPECT_EQ(ST_LITERAL("xx1111011xx"), ST::format("xx{b}xx", (unsigned char)123));
    EXPECT_EQ(ST_LITERAL("xx1111111xx"), ST::format("xx{b}xx", std::numeric_limits<int8_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+1111111xx"), ST::format("xx{+b}xx", std::numeric_limits<int8_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx-10000000xx"), ST::format("xx{b}xx", std::numeric_limits<int8_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx-10000000xx"), ST::format("xx{+b}xx", std::numeric_limits<int8_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx11111111xx"), ST::format("xx{b}xx", std::numeric_limits<uint8_t>::max()));

    // 16-bit ints
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{b}xx", (short)0));
    EXPECT_EQ(ST_LITERAL("xx1111011xx"), ST::format("xx{b}xx", (short)123));
    EXPECT_EQ(ST_LITERAL("xx-1111011xx"), ST::format("xx{b}xx", (short)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{b}xx", (unsigned short)0));
    EXPECT_EQ(ST_LITERAL("xx1111011xx"), ST::format("xx{b}xx", (unsigned short)123));
    EXPECT_EQ(ST_LITERAL("xx111111111111111xx"), ST::format("xx{b}xx", std::numeric_limits<int16_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+111111111111111xx"), ST::format("xx{+b}xx", std::numeric_limits<int16_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx-1000000000000000xx"), ST::format("xx{b}xx", std::numeric_limits<int16_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx-1000000000000000xx"), ST::format("xx{+b}xx", std::numeric_limits<int16_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx1111111111111111xx"), ST::format("xx{b}xx", std::numeric_limits<uint16_t>::max()));

    // 32-bit ints
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{b}xx", (int)0));
    EXPECT_EQ(ST_LITERAL("xx1111011xx"), ST::format("xx{b}xx", (int)123));
    EXPECT_EQ(ST_LITERAL("xx-1111011xx"), ST::format("xx{b}xx", (int)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{b}xx", (unsigned int)0));
    EXPECT_EQ(ST_LITERAL("xx1111011xx"), ST::format("xx{b}xx", (unsigned int)123));
    EXPECT_EQ(ST_LITERAL("xx1111111111111111111111111111111xx"),
              ST::format("xx{b}xx", std::numeric_limits<int32_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+1111111111111111111111111111111xx"),
              ST::format("xx{+b}xx", std::numeric_limits<int32_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx-10000000000000000000000000000000xx"),
              ST::format("xx{b}xx", std::numeric_limits<int32_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx-10000000000000000000000000000000xx"),
              ST::format("xx{+b}xx", std::numeric_limits<int32_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx11111111111111111111111111111111xx"),
              ST::format("xx{b}xx", std::numeric_limits<uint32_t>::max()));

    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{b}xx", (long)0));
    EXPECT_EQ(ST_LITERAL("xx1111011xx"), ST::format("xx{b}xx", (long)123));
    EXPECT_EQ(ST_LITERAL("xx-1111011xx"), ST::format("xx{b}xx", (long)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{b}xx", (unsigned long)0));
    EXPECT_EQ(ST_LITERAL("xx1111011xx"), ST::format("xx{b}xx", (unsigned long)123));

    // 64-bit ints
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{b}xx", (long long)0));
    EXPECT_EQ(ST_LITERAL("xx1111011xx"), ST::format("xx{b}xx", (long long)123));
    EXPECT_EQ(ST_LITERAL("xx-1111011xx"), ST::format("xx{b}xx", (long long)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{b}xx", (unsigned long long)0));
    EXPECT_EQ(ST_LITERAL("xx1111011xx"), ST::format("xx{b}xx", (unsigned long long)123));
#ifdef ST_HAVE_INT64
    EXPECT_EQ(ST_LITERAL("xx111111111111111111111111111111111111111111111111111111111111111xx"),
              ST::format("xx{b}xx", std::numeric_limits<int64_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+111111111111111111111111111111111111111111111111111111111111111xx"),
              ST::format("xx{+b}xx", std::numeric_limits<int64_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx-1000000000000000000000000000000000000000000000000000000000000000xx"),
              ST::format("xx{b}xx", std::numeric_limits<int64_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx-1000000000000000000000000000000000000000000000000000000000000000xx"),
              ST::format("xx{+b}xx", std::numeric_limits<int64_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx1111111111111111111111111111111111111111111111111111111111111111xx"),
              ST::format("xx{b}xx", std::numeric_limits<uint64_t>::max()));
#endif
}